

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

string * __thiscall
duckdb::MinimumUniqueAlias_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,BindingAlias *alias,BindingAlias *other)

{
  bool bVar1;
  string *psVar2;
  string *l2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
  l2 = BindingAlias::GetAlias_abi_cxx11_(alias);
  bVar1 = StringUtil::CIEquals(psVar2,l2);
  if (bVar1) {
    bVar1 = StringUtil::CIEquals((string *)(this + 0x20),&alias->schema);
    if (bVar1) {
      BindingAlias::ToString_abi_cxx11_(__return_storage_ptr__,(BindingAlias *)this);
    }
    else {
      ::std::operator+(&local_40,(string *)(this + 0x20),".");
      psVar2 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
      ::std::operator+(__return_storage_ptr__,&local_40,psVar2);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    psVar2 = BindingAlias::GetAlias_abi_cxx11_((BindingAlias *)this);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string MinimumUniqueAlias(const BindingAlias &alias, const BindingAlias &other) {
	if (!StringUtil::CIEquals(alias.GetAlias(), other.GetAlias())) {
		return alias.GetAlias();
	}
	if (!StringUtil::CIEquals(alias.GetSchema(), other.GetSchema())) {
		return alias.GetSchema() + "." + alias.GetAlias();
	}
	return alias.ToString();
}